

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O0

void __thiscall
Assimp::ComputeUVMappingProcess::ComputeSphereMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  aiVector3t<float> *paVar1;
  aiVector3D *paVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  aiVector3t<float> aVar6;
  aiVector3t<float> local_18c;
  aiVector3t<float> local_180;
  aiVector3t<float> local_170;
  aiVector3t<float> local_160;
  aiVector3t<float> local_150;
  ulong local_144;
  aiVector3D diff_3;
  uint pnt_3;
  aiMatrix4x4 mTrafo;
  float local_ec;
  aiVector3t<float> local_e8;
  aiVector3t<float> local_d8;
  ulong local_cc;
  aiVector3D diff_2;
  uint pnt_2;
  float local_b4;
  aiVector3t<float> local_b0;
  aiVector3t<float> local_a0;
  ulong local_94;
  aiVector3D diff_1;
  uint pnt_1;
  float local_7c;
  aiVector3t<float> local_78;
  aiVector3t<float> local_68;
  ulong local_5c;
  aiVector3D diff;
  uint pnt;
  aiVector3D max;
  aiVector3D min;
  aiVector3D center;
  aiVector3D *out_local;
  aiVector3D *axis_local;
  aiMesh *mesh_local;
  ComputeUVMappingProcess *this_local;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&min.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&max.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&diff.z);
  FindMeshCenter(mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)&diff.z);
  fVar3 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_x);
  if (fVar3 < 0.95) {
    fVar3 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y);
    if (fVar3 < 0.95) {
      fVar3 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_z);
      if (fVar3 < 0.95) {
        aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&diff_3.z);
        aiMatrix4x4t<float>::FromToMatrix
                  (axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y,
                   (aiMatrix4x4t<float> *)&diff_3.z);
        for (diff_3.y = 0.0; (uint)diff_3.y < mesh->mNumVertices;
            diff_3.y = (float)((int)diff_3.y + 1)) {
          aVar6 = ::operator*((aiMatrix4x4t<float> *)&diff_3.z,mesh->mVertices + (uint)diff_3.y);
          local_170.z = aVar6.z;
          local_160.z = local_170.z;
          local_170._0_8_ = aVar6._0_8_;
          local_160.x = local_170.x;
          local_160.y = local_170.y;
          local_170 = aVar6;
          aVar6 = ::operator-(&local_160,(aiVector3t<float> *)&min.y);
          local_180._0_8_ = aVar6._0_8_;
          local_150.x = local_180.x;
          local_150.y = local_180.y;
          local_180.z = aVar6.z;
          local_150.z = local_180.z;
          local_180 = aVar6;
          paVar1 = aiVector3t<float>::Normalize(&local_150);
          local_144._0_4_ = paVar1->x;
          local_144._4_4_ = paVar1->y;
          diff_3.x = paVar1->z;
          dVar4 = std::atan2((double)(local_144 >> 0x20),(double)(local_144 & 0xffffffff));
          dVar5 = std::asin((double)(ulong)(uint)diff_3.x);
          aiVector3t<float>::aiVector3t
                    (&local_18c,(SUB84(dVar4,0) + 3.1415927) / 6.2831855,
                     (SUB84(dVar5,0) + 1.5707964) / 3.1415927,0.0);
          paVar2 = out + (uint)diff_3.y;
          paVar2->x = local_18c.x;
          paVar2->y = local_18c.y;
          paVar2->z = local_18c.z;
        }
      }
      else {
        for (diff_2.y = 0.0; (uint)diff_2.y < mesh->mNumVertices;
            diff_2.y = (float)((int)diff_2.y + 1)) {
          aVar6 = ::operator-(mesh->mVertices + (uint)diff_2.y,(aiVector3t<float> *)&min.y);
          local_e8._0_8_ = aVar6._0_8_;
          local_d8.x = local_e8.x;
          local_d8.y = local_e8.y;
          local_e8.z = aVar6.z;
          local_d8.z = local_e8.z;
          paVar1 = aiVector3t<float>::Normalize(&local_d8);
          local_cc._0_4_ = paVar1->x;
          local_cc._4_4_ = paVar1->y;
          diff_2.x = paVar1->z;
          dVar4 = std::atan2((double)(local_cc >> 0x20),(double)(local_cc & 0xffffffff));
          dVar5 = std::asin((double)(ulong)(uint)diff_2.x);
          aiVector3t<float>::aiVector3t
                    ((aiVector3t<float> *)&mTrafo.d3,(SUB84(dVar4,0) + 3.1415927) / 6.2831855,
                     (SUB84(dVar5,0) + 1.5707964) / 3.1415927,0.0);
          paVar2 = out + (uint)diff_2.y;
          paVar2->x = mTrafo.d3;
          paVar2->y = mTrafo.d4;
          paVar2->z = local_ec;
        }
      }
    }
    else {
      for (diff_1.y = 0.0; (uint)diff_1.y < mesh->mNumVertices;
          diff_1.y = (float)((int)diff_1.y + 1)) {
        aVar6 = ::operator-(mesh->mVertices + (uint)diff_1.y,(aiVector3t<float> *)&min.y);
        local_b0._0_8_ = aVar6._0_8_;
        local_a0.x = local_b0.x;
        local_a0.y = local_b0.y;
        local_b0.z = aVar6.z;
        local_a0.z = local_b0.z;
        paVar1 = aiVector3t<float>::Normalize(&local_a0);
        local_94._0_4_ = paVar1->x;
        local_94._4_4_ = paVar1->y;
        diff_1.x = paVar1->z;
        dVar4 = std::atan2((double)(local_94 & 0xffffffff),(double)(ulong)(uint)diff_1.x);
        dVar5 = std::asin((double)(local_94 >> 0x20));
        aiVector3t<float>::aiVector3t
                  ((aiVector3t<float> *)&diff_2.z,(SUB84(dVar4,0) + 3.1415927) / 6.2831855,
                   (SUB84(dVar5,0) + 1.5707964) / 3.1415927,0.0);
        paVar2 = out + (uint)diff_1.y;
        paVar2->x = diff_2.z;
        paVar2->y = (float)pnt_2;
        paVar2->z = local_b4;
      }
    }
  }
  else {
    for (diff.y = 0.0; (uint)diff.y < mesh->mNumVertices; diff.y = (float)((int)diff.y + 1)) {
      aVar6 = ::operator-(mesh->mVertices + (uint)diff.y,(aiVector3t<float> *)&min.y);
      local_78._0_8_ = aVar6._0_8_;
      local_68.x = local_78.x;
      local_68.y = local_78.y;
      local_78.z = aVar6.z;
      local_68.z = local_78.z;
      paVar1 = aiVector3t<float>::Normalize(&local_68);
      local_5c._0_4_ = paVar1->x;
      local_5c._4_4_ = paVar1->y;
      diff.x = paVar1->z;
      dVar4 = std::atan2((double)(ulong)(uint)diff.x,(double)(local_5c >> 0x20));
      dVar5 = std::asin((double)(local_5c & 0xffffffff));
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&diff_1.z,(SUB84(dVar4,0) + 3.1415927) / 6.2831855,
                 (SUB84(dVar5,0) + 1.5707964) / 3.1415927,0.0);
      paVar2 = out + (uint)diff.y;
      paVar2->x = diff_1.z;
      paVar2->y = (float)pnt_1;
      paVar2->z = local_7c;
    }
  }
  RemoveUVSeams(mesh,out);
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputeSphereMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    aiVector3D center, min, max;
    FindMeshCenter(mesh, center, min, max);

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {

        // For each point get a normalized projection vector in the sphere,
        // get its longitude and latitude and map them to their respective
        // UV axes. Problems occur around the poles ... unsolvable.
        //
        // The spherical coordinate system looks like this:
        // x = cos(lon)*cos(lat)
        // y = sin(lon)*cos(lat)
        // z = sin(lat)
        //
        // Thus we can derive:
        // lat  = arcsin (z)
        // lon  = arctan (y/x)
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.z, diff.y) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.x) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        // ... just the same again
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.x, diff.z) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.y) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        // ... just the same again
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.y, diff.x) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.z) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else    {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = ((mTrafo*mesh->mVertices[pnt])-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.y, diff.x) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin(diff.z) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }


    // Now find and remove UV seams. A seam occurs if a face has a tcoord
    // close to zero on the one side, and a tcoord close to one on the
    // other side.
    RemoveUVSeams(mesh,out);
}